

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O2

void rw::d3d9::destroyVertexDeclaration(void *declaration)

{
  (*DAT_00145dd0)();
  return;
}

Assistant:

void
destroyVertexDeclaration(void *declaration)
{
#ifdef RW_D3D9
	if(declaration){
		if(((IUnknown*)declaration)->Release() != 0)
			printf("declaration wasn't destroyed\n");
		d3d9Globals.numVertexDeclarations--;
	}
#else
	rwFree(declaration);
#endif
}